

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void groupConcatValue(sqlite3_context *context)

{
  char *pcVar1;
  int n;
  char *z;
  _func_void_void_ptr *xDel;
  
  if ((short)context->pMem->flags < 0) {
    pcVar1 = context->pMem->z;
  }
  else {
    pcVar1 = (char *)createAggContext(context,0);
  }
  if (pcVar1 == (char *)0x0) {
    return;
  }
  if (pcVar1[0x1c] == '\a') {
    sqlite3_result_error_nomem(context);
    return;
  }
  if (pcVar1[0x1c] == '\x12') {
    context->isError = 0x12;
    sqlite3VdbeMemSetStr
              (context->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  if ((*(int *)(pcVar1 + 0x20) < 1) || (*(int *)(pcVar1 + 0x18) != 0)) {
    if ((ulong)*(uint *)(pcVar1 + 0x18) == 0) {
      z = (char *)0x0;
    }
    else {
      *(undefined1 *)(*(long *)(pcVar1 + 8) + (ulong)*(uint *)(pcVar1 + 0x18)) = 0;
      z = *(char **)(pcVar1 + 8);
    }
    n = *(int *)(pcVar1 + 0x18);
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
  }
  else {
    z = "";
    n = 1;
    xDel = (_func_void_void_ptr *)0x0;
  }
  setResultStrOrError(context,z,n,'\x01',xDel);
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  GroupConcatCtx *pGCC
    = (GroupConcatCtx*)sqlite3_aggregate_context(context, 0);
  if( pGCC ){
    StrAccum *pAccum = &pGCC->str;
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else if( pGCC->nAccum>0 && pAccum->nChar==0 ){
      sqlite3_result_text(context, "", 1, SQLITE_STATIC);
    }else{
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, pAccum->nChar, SQLITE_TRANSIENT);
    }
  }
}